

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionResetsOnDisconnect::RunImpl
          (TestsessionFixtureSessionResetsOnDisconnect *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  sessionFixtureSessionResetsOnDisconnectHelper fixtureHelper;
  bool ctorOk;
  TestsessionFixtureSessionResetsOnDisconnect *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  sessionFixtureSessionResetsOnDisconnectHelper::sessionFixtureSessionResetsOnDisconnectHelper
            ((sessionFixtureSessionResetsOnDisconnectHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionResetsOnDisconnectHelper>
            ((sessionFixtureSessionResetsOnDisconnectHelper *)local_648,
             &(this->super_Test).m_details);
  sessionFixtureSessionResetsOnDisconnectHelper::~sessionFixtureSessionResetsOnDisconnectHelper
            ((sessionFixtureSessionResetsOnDisconnectHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionResetsOnDisconnect) {
  createSession(1);
  object->setResetOnDisconnect(true);
  CHECK(object->getResetOnDisconnect());
}